

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

pool_ptr<soul::AST::VariableDeclaration> __thiscall
soul::RewritingASTVisitor::visitAs<soul::AST::VariableDeclaration>
          (RewritingASTVisitor *this,pool_ptr<soul::AST::VariableDeclaration> *o)

{
  VariableDeclaration *t;
  Statement *pSVar1;
  pool_ptr<soul::AST::VariableDeclaration> *in_RDX;
  
  if (in_RDX->object == (VariableDeclaration *)0x0) {
    pSVar1 = (Statement *)0x0;
  }
  else {
    t = pool_ptr<soul::AST::VariableDeclaration>::operator*(in_RDX);
    pSVar1 = visitObject((RewritingASTVisitor *)o,&t->super_Statement);
  }
  this->_vptr_RewritingASTVisitor = (_func_int **)pSVar1;
  return (pool_ptr<soul::AST::VariableDeclaration>)(VariableDeclaration *)this;
}

Assistant:

pool_ptr<Type> visitAs (pool_ptr<Type> o)
    {
        if (o == nullptr)
            return {};

        SOUL_ASSERT (is_type<Type> (o));
        return static_cast<Type&> (visitObject (*o));
    }